

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

int set_contains_any_cb_iterate(set s,set_key key,set_value value,set_cb_iterate_args args)

{
  int iVar1;
  long in_RCX;
  set_key in_RSI;
  set in_RDI;
  set_contains_any_cb_iterator iterator;
  
  iVar1 = set_contains(in_RDI,in_RSI);
  *(int *)(in_RCX + 8) = iVar1;
  return (int)((*(int *)(in_RCX + 8) != 0 ^ 0xffU) & 1);
}

Assistant:

static int set_contains_any_cb_iterate(set s, set_key key, set_value value, set_cb_iterate_args args)
{
	set_contains_any_cb_iterator iterator = (set_contains_any_cb_iterator)args;

	(void)s;
	(void)value;

	iterator->result = set_contains(iterator->s, key);

	/* Stop iteration if we found an element */
	return !iterator->result;
}